

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

bool spvtools::val::anon_unknown_0::isMissingOffsetInStruct
               (uint32_t struct_id,ValidationState_t *vstate)

{
  ushort uVar1;
  uint32_t *puVar2;
  pointer puVar3;
  pointer puVar4;
  _Bit_type *p_Var5;
  bool bVar6;
  uint uVar7;
  Instruction *pIVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  ulong *puVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  bool bVar13;
  uint uVar14;
  long lVar15;
  ulong *puVar16;
  ulong uVar17;
  uint32_t *puVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> struct_members;
  vector<bool,_std::allocator<bool>_> hasOffset;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<bool,_std::allocator<bool>_> local_70;
  uint32_t *local_48;
  uint32_t *puStack_40;
  uint *local_38;
  
  pIVar8 = ValidationState_t::FindDef(vstate,struct_id);
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (ulong *)0x0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint32_t *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint32_t *)0x0;
  uVar1 = (pIVar8->inst_).opcode;
  if (uVar1 - 0x1c < 2) {
    std::vector<bool,_std::allocator<bool>_>::resize(&local_70,1,true);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar8,1);
    local_48 = (uint32_t *)CONCAT44(local_48._4_4_,uVar7);
    if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_88,
                 (iterator)
                 local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_48);
    }
    else {
      *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar7;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  else if (uVar1 == 0x1e) {
    pIVar8 = ValidationState_t::FindDef(vstate,struct_id);
    local_38 = (uint *)0x0;
    local_48 = (uint32_t *)0x0;
    puStack_40 = (uint32_t *)0x0;
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
               (pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 2,
               (pIVar8->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    puVar4 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = (uint32_t *)0x0;
    puStack_40 = (uint32_t *)0x0;
    local_38 = (uint *)0x0;
    if (puVar3 != (uint32_t *)0x0) {
      operator_delete(puVar3,(long)puVar4 - (long)puVar3);
    }
    if (local_48 != (uint32_t *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_70,
               (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,false);
    local_48 = (uint32_t *)CONCAT44(local_48._4_4_,struct_id);
    pmVar9 = std::
             map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
             ::operator[](&vstate->id_decorations_,(key_type_conflict *)&local_48);
    p_Var5 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    for (p_Var10 = (pmVar9->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &(pmVar9->_M_t)._M_impl.super__Rb_tree_header;
        p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
      if (p_Var10[1]._M_color == 0x23) {
        uVar17 = (ulong)(int)p_Var10[2]._M_color;
        if (uVar17 != 0xffffffffffffffff) {
          if ((p_Var10[1]._M_parent)->_M_color == ~_S_red) {
            bVar6 = true;
            goto LAB_00630a9c;
          }
          uVar11 = uVar17 + 0x3f;
          if (-1 < (long)uVar17) {
            uVar11 = uVar17;
          }
          p_Var5[((long)uVar11 >> 6) +
                 ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               p_Var5[((long)uVar11 >> 6) +
                      ((ulong)((uVar17 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
               1L << ((byte)p_Var10[2]._M_color & 0x3f);
        }
      }
    }
  }
  puVar3 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar13 = false;
    puVar2 = local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      puVar18 = puVar2 + 1;
      bVar6 = isMissingOffsetInStruct(*puVar2,vstate);
      if (bVar6) {
        bVar13 = true;
        break;
      }
      puVar2 = puVar18;
    } while (puVar18 != puVar3);
    bVar6 = true;
    if (bVar13) goto LAB_00630a9c;
  }
  lVar15 = (long)((ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                 ((long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                 (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) >> 2;
  puVar12 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p;
  if (lVar15 < 1) {
    uVar17 = 0;
  }
  else {
    lVar15 = lVar15 + 1;
    uVar17 = 0;
    do {
      uVar7 = (uint)uVar17;
      puVar16 = puVar12;
      if ((*puVar12 >> (uVar17 & 0x3f) & 1) == 0) goto LAB_00630a8e;
      puVar16 = puVar12 + (uVar7 == 0x3f);
      uVar17 = (ulong)(uVar7 + 1);
      if (uVar7 == 0x3f) {
        uVar17 = 0;
      }
      uVar7 = (uint)uVar17;
      if ((*puVar16 >> (uVar17 & 0x3f) & 1) == 0) goto LAB_00630a8e;
      puVar16 = puVar16 + (uVar7 == 0x3f);
      uVar17 = (ulong)(uVar7 + 1);
      if (uVar7 == 0x3f) {
        uVar17 = 0;
      }
      uVar7 = (uint)uVar17;
      if ((*puVar16 >> (uVar17 & 0x3f) & 1) == 0) goto LAB_00630a8e;
      uVar17 = 0;
      if (uVar7 != 0x3f) {
        uVar17 = (ulong)(uVar7 + 1);
      }
      uVar14 = (uint)uVar17;
      puVar16 = puVar16 + (uVar7 == 0x3f);
      uVar7 = uVar14;
      if ((*puVar16 >> (uVar17 & 0x3f) & 1) == 0) goto LAB_00630a8e;
      uVar17 = 0;
      if (uVar14 != 0x3f) {
        uVar17 = (ulong)(uVar14 + 1);
      }
      puVar12 = puVar16 + (uVar14 == 0x3f);
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
  }
  uVar14 = (uint)uVar17;
  lVar15 = (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset - uVar17) +
           ((long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)puVar12)
           * 8;
  if (lVar15 == 1) {
LAB_00630a7a:
    puVar16 = puVar12;
    uVar7 = (uint)uVar17;
    if ((*puVar12 >> (uVar17 & 0x3f) & 1) != 0) {
      puVar16 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p;
      uVar7 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_offset;
    }
  }
  else if (lVar15 == 2) {
LAB_00630a56:
    uVar7 = (uint)uVar17;
    puVar16 = puVar12;
    if ((*puVar12 >> (uVar17 & 0x3f) & 1) != 0) {
      puVar12 = puVar12 + (uVar7 == 0x3f);
      uVar14 = 0;
      if (uVar7 != 0x3f) {
        uVar14 = uVar7 + 1;
      }
      uVar17 = (ulong)uVar14;
      goto LAB_00630a7a;
    }
  }
  else {
    puVar16 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_finish.super__Bit_iterator_base._M_p;
    uVar7 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_offset;
    if ((lVar15 == 3) && (puVar16 = puVar12, uVar7 = uVar14, (*puVar12 >> (uVar17 & 0x3f) & 1) != 0)
       ) {
      uVar17 = 0;
      puVar12 = puVar12 + (uVar14 == 0x3f);
      if (uVar14 != 0x3f) {
        uVar17 = (ulong)(uVar14 + 1);
      }
      goto LAB_00630a56;
    }
  }
LAB_00630a8e:
  bVar6 = uVar7 != local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset ||
          puVar16 !=
          local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p;
LAB_00630a9c:
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return bVar6;
}

Assistant:

bool isMissingOffsetInStruct(uint32_t struct_id, ValidationState_t& vstate) {
  const auto* inst = vstate.FindDef(struct_id);
  std::vector<bool> hasOffset;
  std::vector<uint32_t> struct_members;
  if (inst->opcode() == spv::Op::OpTypeStruct) {
    // Check offsets of member decorations.
    struct_members = getStructMembers(struct_id, vstate);
    hasOffset.resize(struct_members.size(), false);

    for (auto& decoration : vstate.id_decorations(struct_id)) {
      if (spv::Decoration::Offset == decoration.dec_type() &&
          Decoration::kInvalidMember != decoration.struct_member_index()) {
        // Offset 0xffffffff is not valid so ignore it for simplicity's sake.
        if (decoration.params()[0] == 0xffffffff) return true;
        hasOffset[decoration.struct_member_index()] = true;
      }
    }
  } else if (inst->opcode() == spv::Op::OpTypeArray ||
             inst->opcode() == spv::Op::OpTypeRuntimeArray) {
    hasOffset.resize(1, true);
    struct_members.push_back(inst->GetOperandAs<uint32_t>(1u));
  }
  // Look through nested structs (which may be in an array).
  bool nestedStructsMissingOffset = false;
  for (auto id : struct_members) {
    if (isMissingOffsetInStruct(id, vstate)) {
      nestedStructsMissingOffset = true;
      break;
    }
  }
  return nestedStructsMissingOffset ||
         !std::all_of(hasOffset.begin(), hasOffset.end(),
                      [](const bool b) { return b; });
}